

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

float Am_Delayed_Timing_proc(Am_Object *interp,Am_Time *t)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Time local_48;
  Am_Object local_40;
  undefined4 local_38;
  Am_Time local_28;
  Am_Time delay;
  Am_Time *t_local;
  Am_Object *interp_local;
  
  delay.data = (Am_Time_Data *)t;
  in_value = Am_Object::Get(interp,0x104,0);
  Am_Time::Am_Time(&local_28,in_value);
  bVar1 = Am_Time::operator<(t,&local_28);
  if (bVar1) {
    interp_local._4_4_ = 0.0;
  }
  else {
    Am_Object::Am_Object(&local_40,interp);
    Am_Time::operator-(&local_48,t);
    interp_local._4_4_ = Am_Linear_Timing_proc(&local_40,&local_48);
    Am_Time::~Am_Time(&local_48);
    Am_Object::~Am_Object(&local_40);
  }
  local_38 = 1;
  Am_Time::~Am_Time(&local_28);
  return interp_local._4_4_;
}

Assistant:

Am_Define_Method(Am_Timing_Function, float, Am_Delayed_Timing,
                 (Am_Object interp, Am_Time t))
{
  Am_Time delay = interp.Get(Am_INITIAL_DELAY);

  if (t < delay)
    return 0.0;
  else
    return Am_Linear_Timing_proc(interp, t - delay);
}